

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

WebAssemblyModule * __thiscall Wasm::WasmModuleGenerator::GenerateModule(WasmModuleGenerator *this)

{
  Type *pTVar1;
  byte bVar2;
  SourceContextInfo *this_00;
  FunctionBody *pFVar3;
  WebAssemblyModule *pWVar4;
  code *pcVar5;
  byte bVar6;
  bool bVar7;
  BOOLEAN BVar8;
  uint32 initialFunctionCount;
  uint sourceContextId;
  uint32 index;
  WasmFunctionInfo *pWVar9;
  WasmFunctionInfo *func;
  undefined4 *puVar10;
  WasmCompilationException *pWVar11;
  byte bVar12;
  uint32 i;
  uint uVar13;
  uint uVar14;
  WasmFunctionInfo *pWVar15;
  char16_t_conflict local_438 [4];
  char16 offSimpleJit [128];
  char16 offLoopJit [128];
  SectionHeader sectionHeader;
  char16_t_conflict local_138 [4];
  char16 range [64];
  CmdLineArgsParser parser;
  char16 *argv [4];
  undefined1 local_60 [8];
  AutoProfilingPhase wasmPhase;
  BVStatic<14UL> local_40;
  BVStatic<14UL> visitedSections;
  
  local_60 = (undefined1  [8])this->m_scriptContext;
  wasmPhase.scriptcontext._0_2_ = 0x24;
  wasmPhase.scriptcontext._2_1_ = 0;
  Js::ScriptContext::ProfileBegin((ScriptContext *)local_60,WasmReaderPhase);
  WasmBinaryReader::InitializeReader((this->m_module->m_reader).ptr);
  local_40.data[0].word = (Type  [1])(Type)0x0;
  bVar12 = 0;
  do {
    WasmBinaryReader::ReadNextSection
              ((SectionHeader *)(offLoopJit + 0x7c),(this->m_module->m_reader).ptr);
    bVar6 = (byte)offLoopJit[0x7c];
    uVar14 = (uint)(byte)offLoopJit[0x7c];
    if (uVar14 == 0xd) {
      bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,WasmSectionPhase);
      if (bVar7) {
        Output::Print(L"Done reading module\'s sections");
        Output::Print(L"\n");
        Output::Flush();
      }
    }
    else {
      bVar2 = SectionInfo::All[(ulong)(byte)offLoopJit[0x7c] * 0x18 + 4];
      if ((bVar2 != 0xd) && (BVar8 = BVStatic<14UL>::Test(&local_40,(uint)bVar2), BVar8 == '\0')) {
        pWVar11 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (pWVar11,L"%s section missing before %s",
                   *(undefined8 *)(SectionInfo::All + (ulong)bVar2 * 0x18 + 8),sectionHeader._24_8_)
        ;
LAB_00f2ede9:
        __cxa_throw(pWVar11,&WasmCompilationException::typeinfo,
                    WasmCompilationException::~WasmCompilationException);
      }
      BVStatic<14UL>::Set(&local_40,uVar14);
      if (bVar6 != 0) {
        if (bVar6 < bVar12) {
          pWVar11 = (WasmCompilationException *)__cxa_allocate_exception(8);
          WasmCompilationException::WasmCompilationException
                    (pWVar11,L"Invalid Section %s",sectionHeader._24_8_);
          goto LAB_00f2ede9;
        }
        bVar12 = bVar6 + 1;
      }
      bVar7 = WasmBinaryReader::ProcessCurrentSection((this->m_module->m_reader).ptr);
      if (!bVar7) {
        pWVar11 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (pWVar11,L"Error while reading section %s",sectionHeader._24_8_);
        goto LAB_00f2ede9;
      }
    }
  } while (bVar6 != 0xd);
  initialFunctionCount = Js::WebAssemblyModule::GetWasmFunctionCount(this->m_module);
  this_00 = (((this->m_sourceInfo->m_srcInfo).ptr)->sourceContextInfo).ptr;
  Js::Utf8SourceInfo::EnsureInitialized(this->m_sourceInfo,initialFunctionCount);
  pTVar1 = &this_00->nextLocalFunctionId;
  *pTVar1 = *pTVar1 + initialFunctionCount;
  SourceContextInfo::EnsureInitialized(this_00);
  pWVar15 = (WasmFunctionInfo *)0x0;
  if (initialFunctionCount == 0) {
    func = (WasmFunctionInfo *)0x0;
  }
  else {
    do {
      GenerateFunctionHeader(this,(uint32)pWVar15);
      uVar14 = (uint32)pWVar15 + 1;
      pWVar15 = (WasmFunctionInfo *)(ulong)uVar14;
    } while (initialFunctionCount != uVar14);
    visitedSections.data[0].word = (Type  [1])__tls_get_addr(&PTR_0155fe48);
    uVar13 = 0;
    func = (WasmFunctionInfo *)0x0;
    pWVar15 = (WasmFunctionInfo *)0x0;
    wasmPhase._8_8_ = this;
    do {
      pWVar9 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,uVar13);
      if ((pWVar9->m_body).ptr == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)visitedSections.data[0].word = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                           ,0x13a,"(info->GetBody())","info->GetBody()");
        if (!bVar7) goto LAB_00f2ed88;
        *(undefined4 *)visitedSections.data[0].word = 0;
      }
      sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)(pWVar9->m_body).ptr)
      ;
      pFVar3 = (pWVar9->m_body).ptr;
      if ((pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)visitedSections.data[0].word = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar7) goto LAB_00f2ed88;
        *(undefined4 *)visitedSections.data[0].word = 0;
      }
      bVar7 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,WasmInOutPhase,sourceContextId,
                         ((pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr
                         )->functionId);
      this = (WasmModuleGenerator *)wasmPhase._8_8_;
      if (bVar7) {
        index = Js::WebAssemblyModule::GetWasmFunctionCount
                          (*(WebAssemblyModule **)(wasmPhase._8_8_ + 0x18));
        func = Js::WebAssemblyModule::AddWasmFunctionInfo
                         (*(WebAssemblyModule **)((long)this + 0x18),(pWVar9->m_signature).ptr);
        if (pWVar15 == (WasmFunctionInfo *)0x0) {
          pWVar15 = func;
        }
        GenerateFunctionHeader(this,index);
        Js::WebAssemblyModule::SwapWasmFunctionInfo
                  (*(WebAssemblyModule **)((long)this + 0x18),uVar13,index);
        Js::WebAssemblyModule::AttachCustomInOutTracingReader
                  (*(WebAssemblyModule **)((long)this + 0x18),func,index);
      }
      uVar13 = uVar13 + 1;
    } while (initialFunctionCount != uVar13);
  }
  if (pWVar15 != (WasmFunctionInfo *)0x0) {
    uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)(pWVar15->m_body).ptr);
    pFVar3 = (pWVar15->m_body).ptr;
    if ((pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar7) goto LAB_00f2ed88;
      *puVar10 = 0;
    }
    uVar14 = ((pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
             functionId;
    pFVar3 = (func->m_body).ptr;
    if ((pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar7) {
LAB_00f2ed88:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar10 = 0;
    }
    swprintf_s(local_138,0x40,(char16_t_conflict *)L"%d.%d-%d.%d",(ulong)uVar13,(ulong)uVar14,
               (ulong)uVar13,
               ((pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
               functionId);
    swprintf_s((char16_t_conflict *)(offLoopJit + 0x7c),0x80,(char16_t_conflict *)L"-off:fulljit:%s"
               ,local_138);
    swprintf_s(local_438,0x80,(char16_t_conflict *)L"-off:simplejit:%s",local_138);
    swprintf_s((char16_t_conflict *)(offSimpleJit + 0x7c),0x80,
               (char16_t_conflict *)L"-off:jitloopbody:%s",local_138);
    parser.pCustomConfigFlags = (ICustomConfigFlags *)0x0;
    CmdLineArgsParser::CmdLineArgsParser
              ((CmdLineArgsParser *)(range + 0x3c),(ICustomConfigFlags *)0x0,
               (ConfigFlagsTable *)&Js::Configuration::Global);
    CmdLineArgsParser::Parse
              ((CmdLineArgsParser *)(range + 0x3c),4,(LPWSTR *)&parser.pCustomConfigFlags);
    CmdLineArgsParser::~CmdLineArgsParser((CmdLineArgsParser *)(range + 0x3c));
  }
  BVar8 = BVStatic<14UL>::Test(&local_40,3);
  if ((BVar8 != '\0') && (BVar8 = BVStatic<14UL>::Test(&local_40,10), BVar8 == '\0')) {
    pWVar11 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (pWVar11,L"Missing required section: %s",SectionInfo::All._248_8_);
    __cxa_throw(pWVar11,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  pWVar4 = this->m_module;
  Js::AutoProfilingPhase::~AutoProfilingPhase((AutoProfilingPhase *)local_60);
  return pWVar4;
}

Assistant:

Js::WebAssemblyModule* WasmModuleGenerator::GenerateModule()
{
    Js::AutoProfilingPhase wasmPhase(m_scriptContext, Js::WasmReaderPhase);
    Unused(wasmPhase);

    m_module->GetReader()->InitializeReader();

    BVStatic<bSectLimit + 1> visitedSections;

    SectionCode nextExpectedSection = bSectCustom;
    while (true)
    {
        SectionHeader sectionHeader = GetReader()->ReadNextSection();
        SectionCode sectionCode = sectionHeader.code;
        if (sectionCode == bSectLimit)
        {
            TRACE_WASM(PHASE_TRACE1(Js::WasmSectionPhase), _u("Done reading module's sections"));
            break;
        }

        // Make sure dependency for this section has been seen
        SectionCode precedent = SectionInfo::All[sectionCode].precedent;
        if (precedent != bSectLimit && !visitedSections.Test(precedent))
        {
            throw WasmCompilationException(_u("%s section missing before %s"),
                SectionInfo::All[precedent].name,
                sectionHeader.name);
        }
        visitedSections.Set(sectionCode);

        // Custom section are allowed in any order
        if (sectionCode != bSectCustom)
        {
            if (sectionCode < nextExpectedSection)
            {
                throw WasmCompilationException(_u("Invalid Section %s"), sectionHeader.name);
            }
            nextExpectedSection = SectionCode(sectionCode + 1);
        }

        if (!GetReader()->ProcessCurrentSection())
        {
            throw WasmCompilationException(_u("Error while reading section %s"), sectionHeader.name);
        }
    }

    uint32 funcCount = m_module->GetWasmFunctionCount();
    SourceContextInfo * sourceContextInfo = m_sourceInfo->GetSrcInfo()->sourceContextInfo;
    m_sourceInfo->EnsureInitialized(funcCount);
    sourceContextInfo->nextLocalFunctionId += funcCount;
    sourceContextInfo->EnsureInitialized();

    for (uint32 i = 0; i < funcCount; ++i)
    {
        GenerateFunctionHeader(i);
    }

#if ENABLE_DEBUG_CONFIG_OPTIONS
    WasmFunctionInfo* firstThunk = nullptr, *lastThunk = nullptr;
    for (uint32 i = 0; i < funcCount; ++i)
    {
        WasmFunctionInfo* info = m_module->GetWasmFunctionInfo(i);
        Assert(info->GetBody());
        if (PHASE_TRACE(Js::WasmInOutPhase, info->GetBody()))
        {
            uint32 index = m_module->GetWasmFunctionCount();
            WasmFunctionInfo* newInfo = m_module->AddWasmFunctionInfo(info->GetSignature());
            if (!firstThunk)
            {
                firstThunk = newInfo;
            }
            lastThunk = newInfo;
            GenerateFunctionHeader(index);
            m_module->SwapWasmFunctionInfo(i, index);
            m_module->AttachCustomInOutTracingReader(newInfo, index);
        }
    }

    if (firstThunk)
    {
        int sourceId = (int)firstThunk->GetBody()->GetSourceContextId();
        char16 range[64];
        swprintf_s(range, 64, _u("%d.%d-%d.%d"),
                   sourceId, firstThunk->GetBody()->GetLocalFunctionId(),
                   sourceId, lastThunk->GetBody()->GetLocalFunctionId());
        char16 offFullJit[128];
        swprintf_s(offFullJit, 128, _u("-off:fulljit:%s"), range);
        char16 offSimpleJit[128];
        swprintf_s(offSimpleJit, 128, _u("-off:simplejit:%s"), range);
        char16 offLoopJit[128];
        swprintf_s(offLoopJit, 128, _u("-off:jitloopbody:%s"), range);
        char16* argv[] = { nullptr, offFullJit, offSimpleJit, offLoopJit };
        CmdLineArgsParser parser(nullptr);
        parser.Parse(ARRAYSIZE(argv), argv);
    }
#endif

    // If we see a FunctionSignatures section we need to see a FunctionBodies section
    if (visitedSections.Test(bSectFunction) && !visitedSections.Test(bSectFunctionBodies))
    {
        throw WasmCompilationException(_u("Missing required section: %s"), SectionInfo::All[bSectFunctionBodies].name);
    }

    return m_module;
}